

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O1

void basisu::vector<basist::ktx2_level_index>::object_mover
               (void *pDst_void,void *pSrc_void,uint32_t num)

{
  undefined8 *puVar1;
  long lVar2;
  ktx2_level_index *pSrc;
  
  if (num != 0) {
    lVar2 = 0;
    do {
      puVar1 = (undefined8 *)((long)pSrc_void + lVar2);
      *(undefined8 *)((long)pDst_void + lVar2) = *puVar1;
      *(undefined8 *)((long)pDst_void + lVar2 + 8) = puVar1[1];
      *(undefined8 *)((long)pDst_void + lVar2 + 0x10) = puVar1[2];
      lVar2 = lVar2 + 0x18;
    } while (puVar1 + 3 != (undefined8 *)((long)pSrc_void + (ulong)num * 0x18));
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint32_t num)
      {
         T* pSrc = static_cast<T*>(pSrc_void);
         T* const pSrc_end = pSrc + num;
         T* pDst = static_cast<T*>(pDst_void);

         while (pSrc != pSrc_end)
         {
            // placement new
            new (static_cast<void*>(pDst)) T(*pSrc);
            pSrc->~T();
            ++pSrc;
            ++pDst;
         }
      }